

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::connect
          (NetworkAddressHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  void *pvVar3;
  Timer *pTVar4;
  HttpHeaderTable *pHVar5;
  Refcounted *refcounted_1;
  undefined1 *in_R9;
  PromiseNode *ptrCopy;
  AttachmentPromiseNodeBase *this_00;
  ConnectRequest request;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  refcounted;
  undefined1 local_68 [32];
  PromiseArena *local_48;
  undefined1 local_40;
  size_t local_38;
  
  getClient((NetworkAddressHttpClient *)(local_68 + 0x18));
  local_40 = *in_R9;
  local_38 = *(size_t *)(in_R9 + 8);
  HttpClientImpl::connect
            ((HttpClientImpl *)local_68,(int)*(_func_int **)(local_48->bytes + 0x20),__addr,__len);
  uVar2 = local_68._0_8_;
  *(int *)(local_48->bytes + 8) = *(int *)(local_48->bytes + 8) + 1;
  pPVar1 = *(PromiseArena **)(local_68._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_68._0_8_ - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (AttachmentPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,(OwnPromiseNode *)local_68);
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_00640448;
    *(PromiseArena **)((long)pvVar3 + 0x3f0) = local_48;
    *(PromiseArena **)((long)pvVar3 + 0x3f8) = local_48;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    *(PromiseArena **)(local_68._0_8_ + 8) = (PromiseArena *)0x0;
    this_00 = (AttachmentPromiseNodeBase *)(local_68._0_8_ + -0x28);
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,(OwnPromiseNode *)local_68);
    *(undefined ***)(uVar2 + -0x28) = &PTR_destroy_00640448;
    ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)local_48;
    *(PromiseArena **)(uVar2 + -8) = local_48;
    ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)this_00;
  pTVar4 = (Timer *)operator_new(0x28);
  uVar2 = local_68._0_8_;
  (pTVar4->super_MonotonicClock)._vptr_MonotonicClock =
       (_func_int **)&PTR___cxa_pure_virtual_006299b8;
  pTVar4[1].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)local_68._24_8_;
  pTVar4[2].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)local_48;
  pTVar4[3].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)local_68._8_8_;
  pTVar4[4].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)local_68._16_8_;
  (pTVar4->super_MonotonicClock)._vptr_MonotonicClock = (_func_int **)&PTR_disposeImpl_00640498;
  pHVar5 = (HttpHeaderTable *)0x1;
  if ((HttpHeaderTable *)local_68._16_8_ != (HttpHeaderTable *)0x0) {
    pHVar5 = (HttpHeaderTable *)local_68._16_8_;
  }
  this->timer = pTVar4;
  this->responseHeaderTable = pHVar5;
  local_48 = (PromiseArena *)0x0;
  local_68._16_8_ = (_func_int **)0x0;
  if ((PromiseArenaMember *)local_68._0_8_ != (PromiseArenaMember *)0x0) {
    local_68._0_8_ = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    auto refcounted = getClient();
    auto request = refcounted->client->connect(host, headers, settings);
    return ConnectRequest {
      request.status.attach(kj::addRef(*refcounted)),
      request.connection.attach(kj::mv(refcounted))
    };
  }